

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  Vec_Str_t *vFixed;
  int iVar1;
  Vec_Ptr_t *vNodes;
  Vec_Wec_t *vFanins;
  long *plVar2;
  word Entry;
  word *pRes;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Sfm_Ntk_t *pSVar6;
  ulong uVar7;
  ulong uVar8;
  char Entry_00;
  int iVar9;
  int iVar10;
  word (*TruthStore_00) [1024];
  uint uVar11;
  long lVar12;
  int nTotal;
  Vec_Wrd_t *pVStack_220e0;
  Vec_Int_t *pVStack_220d8;
  Vec_Wrd_t *pVStack_220d0;
  Vec_Ptr_t *pVStack_220c8;
  Vec_Str_t *pVStack_220c0;
  word *pTruths [16];
  word pCube [1024];
  word TruthStore [16] [1024];
  
  TruthStore_00 = TruthStore;
  memset(TruthStore_00,0,0x20000);
  pTruths[0xe] = (word *)0x0;
  pTruths[0xf] = (word *)0x0;
  pTruths[0xc] = (word *)0x0;
  pTruths[0xd] = (word *)0x0;
  pTruths[10] = (word *)0x0;
  pTruths[0xb] = (word *)0x0;
  pTruths[8] = (word *)0x0;
  pTruths[9] = (word *)0x0;
  pTruths[6] = (word *)0x0;
  pTruths[7] = (word *)0x0;
  pTruths[4] = (word *)0x0;
  pTruths[5] = (word *)0x0;
  pTruths[2] = (word *)0x0;
  pTruths[3] = (word *)0x0;
  pTruths[0] = (word *)0x0;
  pTruths[1] = (word *)0x0;
  memset(pCube,0,0x2000);
  nTotal = 0;
  vNodes = Abc_NtkAssignIDs2(pNtk);
  iVar10 = vNodes->nSize;
  iVar9 = pNtk->vCis->nSize + iVar10 + pNtk->vCos->nSize;
  vFanins = Vec_WecStart(iVar9);
  pVStack_220c0 = Vec_StrStart(iVar9);
  pVStack_220d0 = Vec_WrdStart(iVar9);
  pVStack_220c8 = vNodes;
  pVStack_220d8 = Abc_NtkAssignStarts(pNtk,vNodes,&nTotal);
  pVStack_220e0 = Vec_WrdAlloc(nTotal);
  Abc_NtkFillTruthStore(TruthStore_00);
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    pTruths[lVar12] = *TruthStore_00;
    TruthStore_00 = TruthStore_00 + 1;
  }
  iVar9 = 0;
  if (iVar10 < 1) {
    iVar10 = iVar9;
  }
  do {
    if (iVar9 == iVar10) {
      for (iVar10 = 0; iVar10 < pNtk->vCos->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar10);
        pVVar4 = Vec_WecEntry(vFanins,(pAVar5->field_6).iTemp);
        Vec_IntGrow(pVVar4,(pAVar5->vFanins).nSize);
        for (lVar12 = 0; lVar12 < (pAVar5->vFanins).nSize; lVar12 = lVar12 + 1) {
          Vec_IntPush(pVVar4,*(int *)((long)pAVar5->pNtk->vObjs->pArray
                                            [(pAVar5->vFanins).pArray[lVar12]] + 0x40));
        }
      }
      Vec_PtrFree(pVStack_220c8);
      vFixed = pVStack_220c0;
      for (iVar10 = 0; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar10);
        if (((pAVar5 != (Abc_Obj_t *)0x0) && (iPivot <= iVar10)) &&
           ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
          Vec_StrWriteEntry(vFixed,(pAVar5->field_6).iTemp,Entry_00);
        }
      }
      pSVar6 = Sfm_NtkConstruct(vFanins,pNtk->vCis->nSize,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,
                                pVStack_220d0,pVStack_220d8,pVStack_220e0);
      return pSVar6;
    }
    plVar2 = (long *)Vec_PtrEntry(pVStack_220c8,iVar9);
    iVar1 = *(int *)((long)plVar2 + 0x1c);
    if (iVar1 < 7) {
      Entry = Abc_SopToTruth((char *)plVar2[7],iVar1);
      Vec_WrdWriteEntry(pVStack_220d0,(int)plVar2[8],Entry);
      if (Entry - 1 < 0xfffffffffffffffe) {
LAB_0029b9a7:
        pVVar4 = Vec_WecEntry(vFanins,(int)plVar2[8]);
        Vec_IntGrow(pVVar4,*(int *)((long)plVar2 + 0x1c));
        for (lVar12 = 0; lVar12 < *(int *)((long)plVar2 + 0x1c); lVar12 = lVar12 + 1) {
          Vec_IntPush(pVVar4,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                               (long)*(int *)(plVar2[4] + lVar12 * 4) * 8) + 0x40));
        }
      }
    }
    else {
      uVar11 = 1 << ((char)iVar1 - 6U & 0x1f);
      iVar1 = Vec_IntEntry(pVStack_220d8,(int)plVar2[8]);
      pRes = Vec_WrdEntryP(pVStack_220e0,iVar1);
      Abc_SopToTruthBig((char *)plVar2[7],*(int *)((long)plVar2 + 0x1c),pTruths,pCube,pRes);
      uVar3 = 0;
      if (0 < (int)uVar11) {
        uVar3 = (ulong)uVar11;
      }
      for (uVar7 = 0; (uVar8 = uVar3, uVar3 != uVar7 && (uVar8 = uVar7, pRes[uVar7] == 0));
          uVar7 = uVar7 + 1) {
      }
      if ((uint)uVar8 != uVar11) {
        for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
          if (pRes[uVar7] != 0xffffffffffffffff) {
            uVar3 = uVar7 & 0xffffffff;
            break;
          }
        }
        if ((uint)uVar3 != uVar11) goto LAB_0029b9a7;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdAlloc( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}